

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

void savenames(memfile *mf)

{
  int local_14;
  int i;
  memfile *mf_local;
  
  mtag(mf,0,MTAG_OCLASSES);
  mfmagic_set(mf,0x4c4c434f);
  for (local_14 = 0; local_14 < 0x12; local_14 = local_14 + 1) {
    mwrite32(mf,bases[local_14]);
  }
  for (local_14 = 0; local_14 < 0x21a; local_14 = local_14 + 1) {
    mwrite32(mf,(int)disco[local_14]);
  }
  for (local_14 = 0; local_14 < 0x21a; local_14 = local_14 + 1) {
    saveobjclass(mf,objects + local_14);
  }
  return;
}

Assistant:

void savenames(struct memfile *mf)
{
	int i;

	mtag(mf, 0, MTAG_OCLASSES);
	mfmagic_set(mf, OCLASSES_MAGIC);
	for (i = 0; i < MAXOCLASSES; i++)
	    mwrite32(mf, bases[i]);

	for (i = 0; i < NUM_OBJECTS; i++)
	    mwrite32(mf, disco[i]);

	for (i = 0; i < NUM_OBJECTS; i++)
	    saveobjclass(mf, &objects[i]);
}